

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,
                            JSON<pstack::Procman::StackFrame,_pstack::Procman::Process_*> *jt)

{
  StackFrame *this;
  bool bVar1;
  JObject *pJVar2;
  pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *v;
  ostream *poVar3;
  char local_131;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_130;
  char local_113;
  JsonNull local_112;
  char local_111;
  MaybeNamedSymbol local_110;
  optional *local_d0;
  MaybeNamedSymbol *sym;
  Addr local_c0;
  char local_b4 [4];
  Addr local_b0;
  undefined1 local_a8 [8];
  JObject jo;
  undefined1 local_88 [8];
  PrintableFrame pframe;
  ProcessLocation location;
  StackFrame *frame;
  JSON<pstack::Procman::StackFrame,_pstack::Procman::Process_*> *jt_local;
  ostream *os_local;
  
  this = jt->object;
  Procman::StackFrame::scopeIP
            ((ProcessLocation *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,*jt->context);
  Procman::PrintableFrame::PrintableFrame((PrintableFrame *)local_88,*jt->context,this);
  JObject::JObject((JObject *)local_a8,os);
  local_b0 = Procman::StackFrame::rawIP(this);
  local_b4[3] = 0;
  pJVar2 = JObject::field<char[3],unsigned_long,char>
                     ((JObject *)local_a8,(char (*) [3])"ip",&local_b0,local_b4 + 3);
  local_b4[2] = 0;
  pJVar2 = JObject::field<char[7],unsigned_long,char>
                     (pJVar2,(char (*) [7])"offset",
                      (unsigned_long *)(pframe.dieName.field_2._M_local_buf + 8),local_b4 + 2);
  local_b4[1] = 0;
  pJVar2 = JObject::field<char[11],bool,char>
                     (pJVar2,(char (*) [11])0x1cff21,&this->isSignalTrampoline,local_b4 + 1);
  local_b4[0] = '\0';
  pJVar2 = JObject::field<char[4],std::__cxx11::string,char>
                     (pJVar2,(char (*) [4])"die",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe,
                      local_b4);
  local_c0 = Procman::ProcessLocation::elfReloc
                       ((ProcessLocation *)
                        &pframe.inlined.
                         super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sym._7_1_ = 0;
  JObject::field<char[9],unsigned_long,char>
            (pJVar2,(char (*) [9])"loadaddr",&local_c0,(char *)((long)&sym + 7));
  Procman::ProcessLocation::symbol_abi_cxx11_
            (&local_110,
             (ProcessLocation *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_d0 = (optional *)&local_110;
  bVar1 = std::optional::operator_cast_to_bool(local_d0);
  if (bVar1) {
    v = std::
        optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator*((optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d0);
    local_111 = '\0';
    JObject::field<char[7],std::pair<Elf64_Sym,std::__cxx11::string>,char>
              ((JObject *)local_a8,(char (*) [7])"symbol",v,&local_111);
  }
  else {
    local_113 = '\0';
    JObject::field<char[7],pstack::JsonNull,char>
              ((JObject *)local_a8,(char (*) [7])"symbol",&local_112,&local_113);
  }
  Procman::ProcessLocation::source_abi_cxx11_
            (&local_130,
             (ProcessLocation *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_131 = '\0';
  JObject::
  field<char[7],std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>,char>
            ((JObject *)local_a8,(char (*) [7])"source",&local_130,&local_131);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_130);
  poVar3 = JObject::operator_cast_to_ostream_((JObject *)local_a8);
  std::
  optional<std::pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~optional(&local_110);
  JObject::~JObject((JObject *)local_a8);
  Procman::PrintableFrame::~PrintableFrame((PrintableFrame *)local_88);
  Procman::ProcessLocation::~ProcessLocation
            ((ProcessLocation *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return poVar3;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Procman::StackFrame, Procman::Process *> &jt)
{
    auto &frame =jt.object;
    Procman::ProcessLocation location = frame.scopeIP(*jt.context);
    Procman::PrintableFrame pframe(*jt.context, frame);

    JObject jo(os);
    jo
        .field("ip", frame.rawIP())
        .field("offset", pframe.functionOffset)
        .field("trampoline", frame.isSignalTrampoline)
        .field("die", pframe.dieName)
        .field("loadaddr", location.elfReloc())
        ;

    const auto &sym = location.symbol();
    if (sym)
        jo.field("symbol", *sym);
    else
        jo.field("symbol", JsonNull());

    jo.field("source", location.source());

    return jo;
}